

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O3

bool helics::fileops::isMember(value *element,string *key)

{
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  value uval;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  basic_value<toml::type_config> bStack_1b8;
  basic_value<toml::type_config> local_f0;
  
  toml::basic_value<toml::type_config>::basic_value(&bStack_1b8);
  v = toml::find_or<toml::type_config,std::__cxx11::string>(element,key,&bStack_1b8);
  toml::basic_value<toml::type_config>::basic_value(&local_f0,v);
  toml::basic_value<toml::type_config>::cleanup(&local_f0,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f0.comments_);
  toml::detail::region::~region(&local_f0.region_);
  toml::basic_value<toml::type_config>::cleanup(&bStack_1b8,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&bStack_1b8.comments_);
  toml::detail::region::~region(&bStack_1b8.region_);
  return local_f0.type_ != empty;
}

Assistant:

inline bool isMember(const toml::value& element, const std::string& key)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    return (!val.is_empty());
}